

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O0

bool __thiscall Catch::TestSpecParser::isControlChar(TestSpecParser *this,char c)

{
  bool local_29;
  char c_local;
  TestSpecParser *this_local;
  
  switch(this->m_mode) {
  case None:
    this_local._7_1_ = c == '~';
    break;
  case Name:
    this_local._7_1_ = c == '[';
    break;
  case QuotedName:
    this_local._7_1_ = c == '\"';
    break;
  case Tag:
    local_29 = c == '[' || c == ']';
    this_local._7_1_ = local_29;
    break;
  case EscapedName:
    this_local._7_1_ = true;
    break;
  default:
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool TestSpecParser::isControlChar( char c ) const {
        switch( m_mode ) {
            default:
                return false;
            case None:
                return c == '~';
            case Name:
                return c == '[';
            case EscapedName:
                return true;
            case QuotedName:
                return c == '"';
            case Tag:
                return c == '[' || c == ']';
        }
    }